

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall GEO::Delaunay3d::show_list(Delaunay3d *this,index_t first,string *list_name)

{
  ostream *poVar1;
  ulong uVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"tet list: ",10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(list_name->_M_dataplus)._M_p,
                      list_name->_M_string_length);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  for (uVar2 = (ulong)first; (index_t)uVar2 != 0x7fffffff;
      uVar2 = (ulong)(this->cell_next_).
                     super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                     super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar2]) {
    show_tet(this,(index_t)uVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"-------------",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  return;
}

Assistant:

void Delaunay3d::show_list(
        index_t first, const std::string& list_name
    ) const {
        index_t t = first;
        std::cerr << "tet list: " << list_name << std::endl;
        while(t != END_OF_LIST) {
            show_tet(t);
            t = tet_next(t);
        }
        std::cerr << "-------------" << std::endl;
    }